

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDiag.cpp
# Opt level: O2

JsErrorCode
JsDiagStartDebugging
          (JsRuntimeHandle runtimeHandle,JsDiagDebugEventCallback debugEventCallback,
          void *callbackState)

{
  DWORD *pDVar1;
  ThreadContext *threadContext;
  ScriptContext *this;
  ProbeContainer *this_00;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  HRESULT hr;
  JsrtRuntime *this_01;
  JsrtDebugManager *pJVar5;
  undefined4 *puVar6;
  DebugContext *this_02;
  JsErrorCode JVar7;
  ScriptContext **ppSVar8;
  AutoNestedHandledExceptionType local_68 [2];
  TTDebuggerAbortException anon_var_0;
  ThreadContextScope local_40;
  
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (runtimeHandle == (JsRuntimeHandle)0x0) {
    JVar7 = JsErrorInvalidArgument;
    goto LAB_003a072d;
  }
  if (debugEventCallback == (JsDiagDebugEventCallback)0x0) {
    JVar7 = JsErrorNullArgument;
    goto LAB_003a072d;
  }
  this_01 = JsrtRuntime::FromHandle(runtimeHandle);
  threadContext = this_01->threadContext;
  if (threadContext->recycler != (Recycler *)0x0) {
    bVar3 = Memory::Recycler::IsHeapEnumInProgress(threadContext->recycler);
    JVar7 = JsErrorHeapEnumInProgress;
    if (bVar3) goto LAB_003a072d;
  }
  JVar7 = JsErrorInThreadServiceCallback;
  if (((threadContext->threadService).isInCallback != false) ||
     (JVar7 = JsErrorRuntimeInUse, threadContext->callRootLevel != 0)) goto LAB_003a072d;
  ThreadContextScope::ThreadContextScope(&local_40,threadContext);
  JVar7 = JsErrorWrongThread;
  if (local_40.isValid != false) {
    pJVar5 = JsrtRuntime::GetJsrtDebugManager(this_01);
    if (pJVar5 != (JsrtDebugManager *)0x0) {
      pJVar5 = JsrtRuntime::GetJsrtDebugManager(this_01);
      bVar3 = JsrtDebugManager::IsDebugEventCallbackSet(pJVar5);
      JVar7 = JsErrorDiagAlreadyInDebugMode;
      if (bVar3) goto LAB_003a0714;
    }
    JsrtRuntime::EnsureJsrtDebugManager(this_01);
    pJVar5 = JsrtRuntime::GetJsrtDebugManager(this_01);
    JsrtDebugManager::SetDebugEventCallback(pJVar5,debugEventCallback,callbackState);
    if (threadContext->debugManager != (DebugManager *)0x0) {
      pDVar1 = &threadContext->debugManager->localsDisplayFlags;
      *(byte *)pDVar1 = (byte)*pDVar1 | 1;
    }
    ppSVar8 = &this_01->threadContext->scriptContextList;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    anon_var_0.m_staticAbortMessage = (char16 *)&pJVar5->super_HostDebugContext;
    while( true ) {
      this = *ppSVar8;
      JVar7 = JsNoError;
      if (this == (ScriptContext *)0x0) break;
      iVar4 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
      if ((char)iVar4 != '\0') break;
      bVar3 = Js::ScriptContext::IsScriptContextInDebugMode(this);
      if (bVar3) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtDiag.cpp"
                           ,0x56,"(!scriptContext->IsScriptContextInDebugMode())",
                           "!scriptContext->IsScriptContextInDebugMode()");
        if (!bVar3) goto LAB_003a0a02;
        *puVar6 = 0;
      }
      this_02 = Js::ScriptContext::GetDebugContext(this);
      if (this_02->hostDebugContext == (HostDebugContext *)0x0) {
        Js::DebugContext::SetHostDebugContext
                  (this_02,(HostDebugContext *)anon_var_0.m_staticAbortMessage);
      }
      hr = Js::ScriptContext::OnDebuggerAttached(this);
      if (hr < 0) {
        Debugger_AttachDetach_unrecoverable_error(hr);
        ThreadContextScope::~ThreadContextScope(&local_40);
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/JsrtInternal.h"
                           ,0x89,
                           "(errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated)"
                           ,
                           "errCode != JsErrorFatal && errCode != JsErrorNoCurrentContext && errCode != JsErrorInExceptionState && errCode != JsErrorInDisabledState && errCode != JsErrorOutOfMemory && errCode != JsErrorScriptException && errCode != JsErrorScriptTerminated"
                          );
        if (!bVar3) {
LAB_003a0a02:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
        JVar7 = JsErrorFatal;
        goto LAB_003a072d;
      }
      iVar4 = (*(this->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(this);
      if ((char)iVar4 == '\0') {
        this_00 = this_02->diagProbesContainer;
        Js::ProbeContainer::InitializeInlineBreakEngine(this_00,&pJVar5->super_HaltCallback);
        Js::ProbeContainer::InitializeDebuggerScriptOptionCallback
                  (this_00,&pJVar5->super_DebuggerOptionsCallback);
      }
      ppSVar8 = &this->next;
    }
  }
LAB_003a0714:
  ThreadContextScope::~ThreadContextScope(&local_40);
LAB_003a072d:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
  return JVar7;
}

Assistant:

CHAKRA_API JsDiagStartDebugging(
    _In_ JsRuntimeHandle runtimeHandle,
    _In_ JsDiagDebugEventCallback debugEventCallback,
    _In_opt_ void* callbackState)
{
#ifndef ENABLE_SCRIPT_DEBUGGING
    return JsErrorCategoryUsage;
#else
    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {

        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        PARAM_NOT_NULL(debugEventCallback);

        JsrtRuntime * runtime = JsrtRuntime::FromHandle(runtimeHandle);
        ThreadContext * threadContext = runtime->GetThreadContext();

        VALIDATE_RUNTIME_STATE_FOR_START_STOP_DEBUGGING(threadContext);

        if (runtime->GetJsrtDebugManager() != nullptr && runtime->GetJsrtDebugManager()->IsDebugEventCallbackSet())
        {
            return JsErrorDiagAlreadyInDebugMode;
        }

        // Create the debug object to save callback function and data
        runtime->EnsureJsrtDebugManager();

        JsrtDebugManager* jsrtDebugManager = runtime->GetJsrtDebugManager();

        jsrtDebugManager->SetDebugEventCallback(debugEventCallback, callbackState);

        if (threadContext->GetDebugManager() != nullptr)
        {
            threadContext->GetDebugManager()->SetLocalsDisplayFlags(Js::DebugManager::LocalsDisplayFlags::LocalsDisplayFlags_NoGroupMethods);
        }

        for (Js::ScriptContext *scriptContext = runtime->GetThreadContext()->GetScriptContextList();
        scriptContext != nullptr && !scriptContext->IsClosed();
            scriptContext = scriptContext->next)
        {
            Assert(!scriptContext->IsScriptContextInDebugMode());

            Js::DebugContext* debugContext = scriptContext->GetDebugContext();

            if (debugContext->GetHostDebugContext() == nullptr)
            {
                debugContext->SetHostDebugContext(jsrtDebugManager);
            }

            HRESULT hr;
            if (FAILED(hr = scriptContext->OnDebuggerAttached()))
            {
                Debugger_AttachDetach_unrecoverable_error(hr); // Inconsistent state, we can't continue from here
                return JsErrorFatal;
            }

            // ScriptContext might get closed in OnDebuggerAttached
            if (!scriptContext->IsClosed())
            {
                Js::ProbeContainer* probeContainer = debugContext->GetProbeContainer();
                probeContainer->InitializeInlineBreakEngine(jsrtDebugManager);
                probeContainer->InitializeDebuggerScriptOptionCallback(jsrtDebugManager);
            }
        }

        return JsNoError;
    });
#endif
}